

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O3

string * __thiscall
cfd::core::AbstractTransaction::GetHex_abi_cxx11_
          (string *__return_storage_ptr__,AbstractTransaction *this)

{
  ByteData local_28;
  
  (*this->_vptr_AbstractTransaction[8])(&local_28);
  ByteData::GetHex_abi_cxx11_(__return_storage_ptr__,&local_28);
  if (local_28.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AbstractTransaction::GetHex() const { return GetData().GetHex(); }